

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_input_any_mouse_click_in_rect(nk_input *in,nk_rect b)

{
  int iVar1;
  undefined1 local_29;
  undefined4 local_28;
  undefined4 local_24;
  int down;
  int i;
  nk_input *in_local;
  nk_rect b_local;
  
  local_28 = 0;
  for (local_24 = NK_BUTTON_LEFT; (int)local_24 < 4; local_24 = local_24 + NK_BUTTON_MIDDLE) {
    local_29 = true;
    if (local_28 == 0) {
      iVar1 = nk_input_is_mouse_click_in_rect(in,local_24,b);
      local_29 = iVar1 != 0;
    }
    local_28 = (uint)local_29;
  }
  return local_28;
}

Assistant:

NK_API int
nk_input_any_mouse_click_in_rect(const struct nk_input *in, struct nk_rect b)
{
    int i, down = 0;
    for (i = 0; i < NK_BUTTON_MAX; ++i)
        down = down || nk_input_is_mouse_click_in_rect(in, (enum nk_buttons)i, b);
    return down;
}